

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_var_statement_t *stmt)

{
  element_type *peVar1;
  pointer pcVar2;
  long lVar3;
  integer_variables_t *piVar4;
  clock_variables_t *pcVar5;
  expression_t *expr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  typed_local_var_statement_t *ptVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  statement_type_t stmt_type;
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  shared_ptr<const_tchecker::typed_expression_t> init;
  string name;
  statement_type_t local_f0;
  undefined1 local_e9;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  typed_local_var_statement_t *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  integer_variables_t *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  local_var_statement_t *local_78;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  peVar1 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (peVar1->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (peVar1->_name)._M_string_length);
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_e8,
         (key_type *)
         &(this->_localvars).
          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._index._value_map);
  local_a0 = &this->_localvars;
  if ((pointer)local_e8._0_8_ ==
      (this->_localvars).
      super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._index._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
      *(stored_size_type *)
       ((long)&(this->_localvars).
               super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._index._value_map.m_flat_tree + 8)) {
    piVar4 = this->_intvars;
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_e8,
           (key_type *)
           &(piVar4->
            super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._index._value_map);
    if ((pointer)local_e8._0_8_ ==
        (piVar4->
        super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._index._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
        *(stored_size_type *)
         ((long)&(piVar4->
                 super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._index._value_map.m_flat_tree.m_data + 8)) {
      local_f0 = STMT_TYPE_LOCAL_INT;
      integer_variables_t::declare(local_a0,&local_98,1,-0x80000000,0x7fffffff,0);
      goto LAB_00198f61;
    }
    local_f0 = STMT_TYPE_BAD;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "local variable already exists: ",&local_98);
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              ((_Any_data *)&this->_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  else {
    local_f0 = STMT_TYPE_BAD;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "local variable already exists: ",&local_98);
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              ((_Any_data *)&this->_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
LAB_00198f61:
  peVar1 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)(*(long *)peVar1 + -0x38);
  piVar4 = this->_intvars;
  pcVar5 = this->_clocks;
  local_78 = stmt;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_50,&this->_error);
  typecheck((tchecker *)local_c8._M_local_buf,(expression_t *)((long)&peVar1->field_0x0 + lVar3),
            local_a0,piVar4,pcVar5,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_50);
  if (local_c8._M_allocated_capacity == 0) {
    local_e8._0_8_ = (pointer)0x0;
  }
  else {
    local_e8._0_8_ =
         __dynamic_cast(local_c8._M_allocated_capacity,&typed_expression_t::typeinfo,
                        &typed_var_expression_t::typeinfo,0);
  }
  if ((pointer)local_e8._0_8_ == (pointer)0x0) {
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_e8._8_8_ = local_c8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  expr = (local_78->_initial_value).
         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar4 = this->_intvars;
  pcVar5 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_70,&this->_error);
  typecheck((tchecker *)&local_b8,expr,local_a0,piVar4,pcVar5,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_70);
  local_c8._M_allocated_capacity = (size_type)local_b8;
  local_c8._8_8_ = a_Stack_b0[0]._M_pi;
  local_b8 = (typed_local_var_statement_t *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  bVar8 = integer_valued(*(expression_type_t *)(local_c8._M_allocated_capacity + 8));
  if (!bVar8) {
    local_f0 = STMT_TYPE_BAD;
  }
  local_b8 = (typed_local_var_statement_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_local_var_statement_t,std::allocator<tchecker::typed_local_var_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            (a_Stack_b0,&local_b8,(allocator<tchecker::typed_local_var_statement_t> *)&local_e9,
             &local_f0,(shared_ptr<const_tchecker::typed_var_expression_t> *)local_e8,
             (shared_ptr<const_tchecker::typed_expression_t> *)&local_c8);
  _Var7._M_pi = a_Stack_b0[0]._M_pi;
  ptVar6 = local_b8;
  local_b8 = (typed_local_var_statement_t *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_typed_stmt).
            super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &ptVar6->super_typed_statement_t;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void visit(tchecker::local_var_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type;

    std::string name = stmt.variable().name();
    if (_localvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else {
      stmt_type = tchecker::STMT_TYPE_LOCAL_INT;
      _localvars.declare(name, 1, tchecker::int_minval, tchecker::int_maxval, 0);
    }

    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> init{
        tchecker::typecheck(stmt.initial_value(), _localvars, _intvars, _clocks, _error)};

    if (!tchecker::integer_valued(init->type()))
      stmt_type = tchecker::STMT_TYPE_BAD;

    _typed_stmt = std::make_shared<tchecker::typed_local_var_statement_t>(stmt_type, variable, init);
  }